

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O3

void __thiscall adios2::plugin::EncryptionOperator::EncryptImpl::~EncryptImpl(EncryptImpl *this)

{
  pointer pcVar1;
  
  sodium_munlock(this->Key,0x20);
  pcVar1 = (this->KeyFilename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->KeyFilename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~EncryptImpl()
    {
        // unlocks the memory location as well as zeroing out the data
        sodium_munlock(Key, crypto_secretbox_KEYBYTES);
    }